

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

bool __thiscall
TPZMatrix<std::complex<double>_>::SolveEigensystemJacobi
          (TPZMatrix<std::complex<double>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<std::complex<double>_> *Eigenvalues,TPZFMatrix<std::complex<double>_> *Eigenvectors
          )

{
  long lVar1;
  int64_t j;
  long lVar2;
  ulong uVar3;
  long lVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  TPZFNMatrix<9,_std::complex<double>_> Matrix;
  undefined1 *local_140;
  TPZVec<int> local_128;
  int local_108 [6];
  undefined **local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [160];
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  local_140 = (undefined1 *)0x0;
  TPZVec<int>::TPZVec(&local_128,0);
  local_128._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_128.fStore = local_108;
  local_128.fNElements = 0;
  local_128.fNAlloc = 0;
  local_f0 = &PTR__TPZVec_01819178;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  uVar3 = lVar1 * lVar1;
  if ((uVar3 != 0) && (local_140 = local_d0, 9 < (long)uVar3)) {
    local_140 = (undefined1 *)operator_new__(-(ulong)(uVar3 >> 0x3c != 0) | uVar3 * 0x10);
    memset(local_140,0,uVar3 * 0x10);
  }
  memset(local_d0,0,0xa0);
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      lVar2 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar4,lVar2);
        if ((lVar1 <= lVar4) || (lVar1 <= lVar2)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(ulong *)(local_140 + lVar4 * 0x10 + lVar1 * lVar2 * 0x10) =
             CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        *(undefined8 *)(local_140 + lVar4 * 0x10 + 8 + lVar1 * lVar2 * 0x10) = in_XMM1_Qa;
        lVar2 = lVar2 + 1;
      } while (lVar1 != lVar2);
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x5a9);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}